

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall Dialog::check_mouse_over(Dialog *this,int mx,int my)

{
  Widget *pWVar1;
  char cVar2;
  int iVar3;
  _List_node_base *p_Var4;
  
  pWVar1 = this->mouse_over_widget;
  if ((pWVar1 != (Widget *)0x0) &&
     (iVar3 = (*pWVar1->_vptr_Widget[2])(pWVar1,(ulong)(uint)mx,(ulong)(uint)my),
     (char)iVar3 != '\0')) {
    return;
  }
  p_Var4 = (this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  while( true ) {
    if (p_Var4 == (_List_node_base *)&this->all_widgets) {
      if (this->mouse_over_widget != (Widget *)0x0) {
        (*this->mouse_over_widget->_vptr_Widget[5])();
        this->mouse_over_widget = (Widget *)0x0;
      }
      return;
    }
    cVar2 = (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x10))(p_Var4[1]._M_next,mx,my);
    if ((cVar2 != '\0') &&
       (cVar2 = (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x18))(), cVar2 != '\0')) break;
    p_Var4 = p_Var4->_M_next;
  }
  pWVar1 = (Widget *)p_Var4[1]._M_next;
  this->mouse_over_widget = pWVar1;
  (*(code *)((_List_node_base *)pWVar1->_vptr_Widget)[2]._M_next)();
  return;
}

Assistant:

void Dialog::check_mouse_over(int mx, int my)
{
   if (this->mouse_over_widget && this->mouse_over_widget->contains(mx, my)) {
      /* no change */
      return;
   }

   for (std::list<Widget*>::iterator it = this->all_widgets.begin();
         it != this->all_widgets.end();
         ++it)
   {
      if ((*it)->contains(mx, my) && (*it)->want_mouse_focus()) {
         this->mouse_over_widget = (*it);
         this->mouse_over_widget->got_mouse_focus();
         return;
      }
   }

   if (this->mouse_over_widget) {
      this->mouse_over_widget->lost_mouse_focus();
      this->mouse_over_widget = NULL;
   }
}